

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O1

void __thiscall
amrex::InterpBndryData::BndryValuesDoIt
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,IntVect *ratio,BCRec *bc,int max_order)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Box *pBVar4;
  FArrayBox *pFVar5;
  FArrayBox *pFVar6;
  undefined1 auVar7 [12];
  Box *pBVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  pointer *ppbVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  pointer *ppbVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  uint uVar55;
  undefined8 *puVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  uint uVar60;
  long lVar61;
  long lVar62;
  uint uVar63;
  uint uVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  int iVar68;
  uint uVar69;
  int iVar70;
  int iVar71;
  bool bVar72;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar73 [16];
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar80;
  undefined1 auVar79 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  Array4<double> crse_array;
  Array4<double> bdry_array;
  Array4<int> mask_array;
  MFIter mfi;
  MFItInfo info;
  MultiFab foo;
  long local_530;
  long local_528;
  undefined8 *local_510;
  long local_508;
  long local_500;
  long local_4f8;
  long local_4e8;
  long local_4c8;
  ulong local_4b8;
  long local_4a8;
  ulong local_490;
  long local_488;
  long local_480;
  int local_428;
  int iStack_424;
  ulong local_358;
  Array4<double> local_340;
  Array4<double> local_300;
  MultiFab *local_2c0;
  BndryRegister *local_2b8;
  FabSet *local_2b0;
  Array4<int> local_2a8;
  long local_268;
  Box *local_260;
  Box *local_258;
  IntVect *local_250;
  undefined1 local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  int local_220;
  Vector<int,_std::allocator<int>_> *local_210;
  Vector<int,_std::allocator<int>_> *local_208;
  Box local_1e0;
  MFItInfo local_1c4;
  MultiFab local_1b0;
  
  uVar54 = (ulong)(uint)bnd_start;
  uVar16 = (ulong)(uint)num_comp;
  local_2c0 = fine;
  local_2b8 = crse;
  if ((bc != (BCRec *)0x0) && (0 < num_comp)) {
    do {
      (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])(this,bc,ratio,uVar54);
      uVar38 = (int)uVar54 + 1;
      uVar54 = (ulong)uVar38;
    } while ((int)uVar38 < num_comp + bnd_start);
  }
  if ((max_order | 2U) != 3) {
    Abort_host("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    return;
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248 = (undefined1  [16])0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340.p = (double *)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab(&local_1b0,&(this->super_BndryData).super_BndryRegister.grids,
                     &(this->super_BndryData).super_BndryRegister.bndry[0].m_mf.
                      super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap,1,0,
                     (MFInfo *)local_248,(FabFactory<amrex::FArrayBox> *)&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  local_1c4.do_tiling = false;
  local_1c4.num_streams = Gpu::Device::max_gpu_streams;
  local_1c4.tilesize.vect[0] = 0;
  local_1c4.tilesize.vect[1] = 0;
  local_1c4.tilesize.vect[2] = 0;
  local_1c4.dynamic = true;
  local_1c4.device_sync = true;
  MFIter::MFIter((MFIter *)local_248,(FabArrayBase *)&local_1b0,&local_1c4);
  if ((int)local_238.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_220) {
    local_258 = &(this->super_BndryData).geom.domain;
    local_2b0 = (this->super_BndryData).super_BndryRegister.bndry;
    local_260 = (Box *)&(this->super_BndryData).geom.domain.bigend;
    local_2b8 = (BndryRegister *)local_2b8->bndry;
    lVar44 = (long)c_start;
    local_268 = (long)f_start << 3;
    lVar28 = (long)bnd_start * 8;
    local_250 = ratio;
    do {
      BATransformer::operator()
                (&local_1e0,(BATransformer *)(local_248._8_8_ + 8),
                 (Box *)((long)(local_210->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(int)local_238.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage] * 0x1c +
                        *(long *)&(((((BoxArray *)(local_248._8_8_ + 8))->m_ref).
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar54 = 0;
      do {
        iVar3 = (int)uVar54;
        uVar22 = (ulong)(uint)((iVar3 + (int)((uVar54 & 0xffffffff) / 3) * -3) * 4);
        bVar72 = 2 < uVar54;
        iVar33 = iVar3 + -3;
        if (!bVar72) {
          iVar33 = iVar3;
        }
        pBVar8 = &local_1e0;
        if (bVar72) {
          pBVar8 = (Box *)&local_1e0.bigend;
        }
        pBVar4 = local_260;
        if (!bVar72) {
          pBVar4 = local_258;
        }
        if ((*(int *)((long)(pBVar8->smallend).vect + uVar22) ==
             *(int *)((long)(pBVar4->smallend).vect + uVar22)) &&
           (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx + (long)iVar33 + 0x19
                     ) != '\x01')) {
          if (local_2c0 != (MultiFab *)0x0) {
            ppbVar17 = &local_238.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_208 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_208->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         (int)local_238.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            ppbVar32 = &local_238.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_208 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar32 = (pointer *)
                         ((local_208->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         (int)local_238.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (0 < num_comp) {
              pFVar5 = local_2b0[uVar54].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17];
              pFVar6 = (local_2c0->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar32];
              iVar3 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
              iVar33 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
              iVar14 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
              iVar11 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
              iVar12 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
              iVar26 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
              iVar21 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
              iVar20 = (pFVar6->super_BaseFab<double>).domain.bigend.vect[0];
              iVar42 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
              iVar70 = (pFVar6->super_BaseFab<double>).domain.bigend.vect[2];
              if (iVar42 < iVar70) {
                iVar70 = iVar42;
              }
              iVar42 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1];
              iVar34 = (pFVar6->super_BaseFab<double>).domain.bigend.vect[1];
              if (iVar42 < iVar34) {
                iVar34 = iVar42;
              }
              iVar42 = iVar20;
              if (iVar11 < iVar20) {
                iVar42 = iVar11;
              }
              lVar57 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[2] - iVar21) + 1);
              iVar71 = iVar21;
              if (iVar21 < iVar14) {
                iVar71 = iVar14;
              }
              iVar68 = iVar26;
              if (iVar26 < iVar33) {
                iVar68 = iVar33;
              }
              iVar35 = iVar12;
              if (iVar12 < iVar3) {
                iVar35 = iVar3;
              }
              lVar30 = (long)iVar71;
              lVar59 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] - iVar26) + 1);
              lVar51 = (long)iVar68;
              lVar40 = (long)((iVar20 - iVar12) + 1);
              local_528 = ((local_268 * lVar57 + lVar30 * 8 + (long)iVar21 * -8) * lVar59 +
                           lVar51 * 8 + (long)iVar26 * -8) * lVar40 + (long)iVar35 * 8 +
                          (long)iVar12 * -8 + (long)(pFVar6->super_BaseFab<double>).dptr;
              lVar23 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[2] - iVar14) + 1);
              lVar46 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[1] - iVar33) + 1);
              lVar31 = (long)((iVar11 - iVar3) + 1);
              local_4f8 = ((lVar28 * lVar23 + lVar30 * 8 + (long)iVar14 * -8) * lVar46 + lVar51 * 8
                          + (long)iVar33 * -8) * lVar31 + (long)iVar35 * 8 + (long)iVar3 * -8 +
                          (long)(pFVar5->super_BaseFab<double>).dptr;
              lVar59 = lVar59 * lVar40 * 8;
              lVar46 = lVar46 * lVar31 * 8;
              uVar22 = 0;
              do {
                lVar52 = local_4f8;
                lVar61 = local_528;
                lVar62 = lVar30;
                if (iVar71 <= iVar70) {
                  do {
                    lVar24 = lVar51;
                    lVar37 = lVar52;
                    lVar53 = lVar61;
                    if (iVar68 <= iVar34) {
                      do {
                        if (iVar35 <= iVar42) {
                          lVar65 = 0;
                          do {
                            *(undefined8 *)(lVar37 + lVar65 * 8) =
                                 *(undefined8 *)(lVar53 + lVar65 * 8);
                            lVar65 = lVar65 + 1;
                          } while ((iVar42 - iVar35) + 1 != (int)lVar65);
                        }
                        lVar24 = lVar24 + 1;
                        lVar53 = lVar53 + lVar40 * 8;
                        lVar37 = lVar37 + lVar31 * 8;
                      } while (iVar34 + 1 != (int)lVar24);
                    }
                    lVar62 = lVar62 + 1;
                    lVar52 = lVar52 + lVar46;
                    lVar61 = lVar61 + lVar59;
                  } while (iVar70 + 1 != (int)lVar62);
                }
                uVar22 = uVar22 + 1;
                local_528 = local_528 + lVar57 * lVar59;
                local_4f8 = local_4f8 + lVar23 * lVar46;
              } while (uVar22 != uVar16);
            }
          }
        }
        else {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_340,
                     (FabArray<amrex::FArrayBox> *)
                     &local_2b8->bndry[uVar54 - 1].m_mf.super_FabArray<amrex::FArrayBox>.os_temp,
                     (MFIter *)local_248);
          this_00 = (FabArray<amrex::FArrayBox> *)(local_2b0 + uVar54);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_300,this_00,(MFIter *)local_248);
          ppbVar17 = &local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_208 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar17 = (pointer *)
                       ((local_208->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       (int)local_238.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          pFVar5 = (this_00->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17];
          uVar38 = ratio->vect[0];
          uVar22 = *(ulong *)(ratio->vect + 1);
          local_428 = (int)uVar22;
          iStack_424 = (int)(uVar22 >> 0x20);
          if (max_order == 1) {
            if (0 < num_comp) {
              uVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
              uVar2 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
              iVar3 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
              iVar33 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1];
              iVar14 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
              iVar11 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
              uVar29 = (ulong)iVar11;
              uVar22 = 0;
              local_4a8 = lVar28;
              do {
                if ((int)uVar1 <= (int)uVar2) {
                  uVar18 = uVar1;
                  do {
                    if (iVar14 <= iVar33) {
                      uVar41 = uVar18 + 1;
                      uVar47 = -uVar41;
                      if (0 < (int)uVar41) {
                        uVar47 = uVar41;
                      }
                      uVar41 = ~(uVar47 >> 2);
                      if (-1 < (int)uVar18) {
                        uVar41 = uVar18 >> 2;
                      }
                      uVar48 = ~(uVar47 >> 1);
                      if (-1 < (int)uVar18) {
                        uVar48 = uVar18 >> 1;
                      }
                      local_510 = (undefined8 *)
                                  ((long)local_300.p +
                                  local_300.nstride * local_4a8 +
                                  ((long)iVar14 - (long)local_300.begin.y) * local_300.jstride * 8 +
                                  ((long)(int)uVar18 - (long)local_300.begin.z) * local_300.kstride
                                  * 8 + (long)local_300.begin.x * -8 + uVar29 * 8);
                      uVar50 = (long)iVar14;
                      do {
                        if (iVar11 <= iVar3) {
                          uVar49 = (uint)uVar50;
                          uVar25 = uVar49 + 1;
                          uVar55 = -uVar25;
                          if (0 < (int)uVar25) {
                            uVar55 = uVar25;
                          }
                          puVar56 = local_510;
                          uVar58 = uVar29;
                          uVar25 = ~(uVar55 >> 2);
                          uVar19 = ~(uVar55 >> 1);
                          if (-1 < (long)uVar50) {
                            uVar25 = (uint)(uVar50 >> 2) & 0x3fffffff;
                            uVar19 = (uint)(uVar50 >> 1) & 0x7fffffff;
                          }
                          do {
                            uVar9 = (uint)uVar58;
                            if (uVar38 == 4) {
                              if ((long)uVar58 < 0) {
                                uVar9 = uVar9 + 1;
                                uVar63 = -uVar9;
                                if (0 < (int)uVar9) {
                                  uVar63 = uVar9;
                                }
                                uVar9 = uVar63 >> 2;
LAB_007527ac:
                                uVar9 = ~uVar9;
                              }
                              else {
                                uVar9 = (uint)(uVar58 >> 2) & 0x3fffffff;
                              }
                            }
                            else if (uVar38 == 2) {
                              if ((long)uVar58 < 0) {
                                uVar9 = uVar9 + 1;
                                uVar63 = -uVar9;
                                if (0 < (int)uVar9) {
                                  uVar63 = uVar9;
                                }
                                uVar9 = uVar63 >> 1;
                                goto LAB_007527ac;
                              }
                              uVar9 = (uint)(uVar58 >> 1) & 0x7fffffff;
                            }
                            else if (uVar38 != 1) {
                              if ((long)uVar58 < 0) {
                                iVar26 = uVar9 + 1;
                                iVar12 = -iVar26;
                                if (0 < iVar26) {
                                  iVar12 = iVar26;
                                }
                                uVar9 = iVar12 / (int)uVar38;
                                goto LAB_007527ac;
                              }
                              uVar9 = (uint)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                                   uVar58 & 0xffffffff) / (long)(int)uVar38);
                            }
                            uVar63 = uVar49;
                            if (((local_428 != 1) && (uVar63 = uVar25, local_428 != 4)) &&
                               (uVar63 = uVar19, local_428 != 2)) {
                              if ((long)uVar50 < 0) {
                                uVar63 = ~((int)uVar55 / local_428);
                              }
                              else {
                                uVar63 = (uint)((long)((ulong)(uint)((int)uVar49 >> 0x1f) << 0x20 |
                                                      uVar50 & 0xffffffff) / (long)local_428);
                              }
                            }
                            uVar10 = uVar18;
                            if (((iStack_424 != 1) && (uVar10 = uVar41, iStack_424 != 4)) &&
                               (uVar10 = uVar48, iStack_424 != 2)) {
                              if ((int)uVar18 < 0) {
                                uVar10 = ~((int)uVar47 / iStack_424);
                              }
                              else {
                                uVar10 = (int)uVar18 / iStack_424;
                              }
                            }
                            *puVar56 = (undefined *)
                                       local_340.p
                                       [((long)(int)uVar63 - (long)local_340.begin.y) *
                                        local_340.jstride +
                                        ((long)(int)uVar9 - (long)local_340.begin.x) +
                                        ((long)(int)uVar10 - (long)local_340.begin.z) *
                                        local_340.kstride + local_340.nstride * (lVar44 + uVar22)];
                            uVar58 = uVar58 + 1;
                            puVar56 = puVar56 + 1;
                          } while (iVar3 + 1 != (int)uVar58);
                        }
                        uVar50 = uVar50 + 1;
                        local_510 = local_510 + local_300.jstride;
                      } while (iVar33 + 1 != (int)uVar50);
                    }
                    bVar72 = uVar18 != uVar2;
                    uVar18 = uVar18 + 1;
                  } while (bVar72);
                }
                uVar22 = uVar22 + 1;
                local_4a8 = local_4a8 + 8;
              } while (uVar22 != uVar16);
            }
          }
          else {
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_2a8,
                       &(this->super_BndryData).masks.
                        super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                        super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar54].m_fa,(MFIter *)local_248);
            if (iVar33 == 2) {
              if (0 < num_comp) {
                uVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
                uVar2 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
                iVar3 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1];
                uVar18 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
                uVar47 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
                iVar33 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
                lVar57 = (long)(int)uVar18;
                local_358 = 0;
                local_4b8 = lVar28;
                do {
                  if ((int)uVar1 <= (int)uVar2) {
                    uVar41 = uVar1;
                    do {
                      if (iVar33 <= iVar3) {
                        uVar49 = uVar41 + 1;
                        uVar48 = -uVar49;
                        if (0 < (int)uVar49) {
                          uVar48 = uVar49;
                        }
                        lVar51 = ((long)(int)uVar41 - (long)local_2a8.begin.z) * local_2a8.kstride;
                        lVar23 = local_340.nstride * (lVar44 + local_358);
                        uVar55 = ~(uVar48 >> 1);
                        uVar49 = ~(uVar48 >> 2);
                        if (-1 < (int)uVar41) {
                          uVar55 = uVar41 >> 1;
                          uVar49 = uVar41 >> 2;
                        }
                        local_530 = (long)local_300.p +
                                    local_300.nstride * local_4b8 +
                                    ((long)iVar33 - (long)local_300.begin.y) * local_300.jstride * 8
                                    + ((long)(int)uVar41 - (long)local_300.begin.z) *
                                      local_300.kstride * 8 + (long)local_300.begin.x * -8 +
                                    lVar57 * 8;
                        lVar46 = lVar51 * 4 + (long)local_2a8.begin.x * -4 + lVar57 * 4;
                        iVar14 = iVar33 - (local_428 + local_2a8.begin.y);
                        iVar11 = (iVar33 + local_428) - local_2a8.begin.y;
                        uVar22 = (long)iVar33;
                        do {
                          if ((int)uVar18 <= (int)uVar47) {
                            uVar25 = (uint)uVar22;
                            uVar9 = uVar25 + 1;
                            uVar19 = -uVar9;
                            if (0 < (int)uVar9) {
                              uVar19 = uVar9;
                            }
                            lVar59 = (uVar22 - (long)local_2a8.begin.y) * local_2a8.jstride;
                            lVar30 = (int)(uVar25 - (local_428 + local_2a8.begin.y)) *
                                     local_2a8.jstride;
                            lVar31 = (int)((local_428 + uVar25) - local_2a8.begin.y) *
                                     local_2a8.jstride;
                            uVar9 = ~(uVar19 >> 2);
                            if (-1 < (long)uVar22) {
                              uVar9 = (uint)(uVar22 >> 2) & 0x3fffffff;
                            }
                            uVar63 = ~(uVar19 >> 1);
                            if (-1 < (long)uVar22) {
                              uVar63 = (uint)(uVar22 >> 1) & 0x7fffffff;
                            }
                            lVar40 = 0;
                            do {
                              lVar52 = lVar57 + lVar40;
                              uVar10 = (uint)((ulong)uVar18 + lVar40);
                              iVar12 = (int)lVar40;
                              if (uVar38 == 4) {
                                if (lVar52 < 0) {
                                  uVar13 = uVar18 + iVar12 + 1;
                                  uVar10 = -uVar13;
                                  if (0 < (int)uVar13) {
                                    uVar10 = uVar13;
                                  }
                                  uVar10 = uVar10 >> 2;
LAB_00754518:
                                  uVar10 = ~uVar10;
                                }
                                else {
                                  uVar10 = uVar10 >> 2;
                                }
                              }
                              else if (uVar38 == 2) {
                                if (lVar52 < 0) {
                                  uVar13 = uVar18 + iVar12 + 1;
                                  uVar10 = -uVar13;
                                  if (0 < (int)uVar13) {
                                    uVar10 = uVar13;
                                  }
                                  uVar10 = uVar10 >> 1;
                                  goto LAB_00754518;
                                }
                                uVar10 = uVar10 >> 1;
                              }
                              else if (uVar38 != 1) {
                                if (lVar52 < 0) {
                                  iVar21 = uVar18 + iVar12 + 1;
                                  iVar26 = -iVar21;
                                  if (0 < iVar21) {
                                    iVar26 = iVar21;
                                  }
                                  uVar10 = iVar26 / (int)uVar38;
                                  goto LAB_00754518;
                                }
                                uVar10 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                                      (ulong)uVar18 + lVar40 & 0xffffffff) /
                                               (long)(int)uVar38);
                              }
                              uVar13 = uVar25;
                              if (((local_428 != 1) && (uVar13 = uVar9, local_428 != 4)) &&
                                 (uVar13 = uVar63, local_428 != 2)) {
                                if ((long)uVar22 < 0) {
                                  uVar13 = ~((int)uVar19 / local_428);
                                }
                                else {
                                  uVar13 = (uint)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20
                                                        | uVar22 & 0xffffffff) / (long)local_428);
                                }
                              }
                              uVar15 = uVar41;
                              if (((iStack_424 != 1) && (uVar15 = uVar49, iStack_424 != 4)) &&
                                 (uVar15 = uVar55, iStack_424 != 2)) {
                                if ((int)uVar41 < 0) {
                                  uVar15 = ~((int)uVar48 / iStack_424);
                                }
                                else {
                                  uVar15 = (int)uVar41 / iStack_424;
                                }
                              }
                              lVar52 = (long)(int)(((uVar18 - uVar38) - local_2a8.begin.x) + iVar12)
                              ;
                              uVar60 = uVar10 - 1;
                              uVar39 = uVar10;
                              if (local_2a8.p[lVar59 + lVar51 + lVar52] == 1) {
                                uVar39 = uVar60;
                              }
                              lVar61 = (long)(int)(((uVar18 + uVar38) - local_2a8.begin.x) + iVar12)
                              ;
                              uVar36 = uVar10 + 1;
                              uVar64 = uVar10;
                              if (local_2a8.p[lVar59 + lVar51 + lVar61] == 1) {
                                uVar64 = uVar36;
                              }
                              lVar24 = (int)(uVar13 - local_340.begin.y) * local_340.jstride;
                              lVar62 = ((long)(int)uVar15 - (long)local_340.begin.z) *
                                       local_340.kstride;
                              dVar74 = 0.0;
                              dVar75 = 0.0;
                              if (uVar64 == uVar39 + 2) {
                                dVar75 = (((double)local_340.p
                                                   [lVar24 + (long)(int)(uVar36 - local_340.begin.x)
                                                             + lVar62 + lVar23] -
                                          (local_340.p
                                           [lVar24 + (long)(int)(uVar10 - local_340.begin.x) +
                                                     lVar62 + lVar23] +
                                          (double)local_340.p
                                                  [lVar24 + (long)(int)(uVar10 - local_340.begin.x)
                                                            + lVar62 + lVar23])) +
                                         (double)local_340.p
                                                 [lVar24 + (long)(int)(uVar60 - local_340.begin.x) +
                                                           lVar62 + lVar23]) * 0.5;
                              }
                              uVar27 = uVar13 - 1;
                              uVar15 = uVar13;
                              if (*(int *)((long)local_2a8.p +
                                          lVar40 * 4 + (long)iVar14 * local_2a8.jstride * 4 + lVar46
                                          ) == 1) {
                                uVar15 = uVar27;
                              }
                              uVar69 = uVar13 + 1;
                              uVar43 = uVar13;
                              if (*(int *)((long)local_2a8.p +
                                          lVar40 * 4 + (long)iVar11 * local_2a8.jstride * 4 + lVar46
                                          ) == 1) {
                                uVar43 = uVar69;
                              }
                              lVar37 = (long)(int)(uVar10 - local_340.begin.x);
                              if (uVar43 == uVar15 + 2) {
                                dVar74 = (((double)local_340.p
                                                   [(int)(uVar69 - local_340.begin.y) *
                                                    local_340.jstride + lVar37 + lVar62 + lVar23] -
                                          (local_340.p[lVar24 + lVar37 + lVar62 + lVar23] +
                                          (double)local_340.p[lVar24 + lVar37 + lVar62 + lVar23])) +
                                         (double)local_340.p
                                                 [(int)(uVar27 - local_340.begin.y) *
                                                  local_340.jstride + lVar37 + lVar62 + lVar23]) *
                                         0.5;
                              }
                              dVar81 = 0.0;
                              if (((local_2a8.p[lVar30 + lVar51 + lVar52] == 1) &&
                                  (local_2a8.p[lVar30 + lVar51 + lVar61] == 1)) &&
                                 ((local_2a8.p[lVar31 + lVar51 + lVar52] == 1 &&
                                  (local_2a8.p[lVar31 + lVar51 + lVar61] == 1)))) {
                                lVar52 = (int)(uVar69 - local_340.begin.y) * local_340.jstride;
                                lVar61 = (int)(uVar27 - local_340.begin.y) * local_340.jstride;
                                dVar81 = ((((double)local_340.p
                                                    [lVar52 + (long)(int)(uVar36 - local_340.begin.x
                                                                         ) + lVar62 + lVar23] -
                                           (double)local_340.p
                                                   [lVar52 + (long)(int)(uVar60 - local_340.begin.x)
                                                             + lVar62 + lVar23]) +
                                          (double)local_340.p
                                                  [lVar61 + (long)(int)(uVar60 - local_340.begin.x)
                                                            + lVar62 + lVar23]) -
                                         (double)local_340.p
                                                 [lVar61 + (long)(int)(uVar36 - local_340.begin.x) +
                                                           lVar62 + lVar23]) * 0.25;
                              }
                              dVar82 = 1.0;
                              if (uVar43 != uVar15 + 1) {
                                dVar82 = 0.5;
                              }
                              dVar83 = 1.0;
                              if (uVar64 != uVar39 + 1) {
                                dVar83 = 0.5;
                              }
                              dVar76 = ((double)(int)(uVar10 * -uVar38 + uVar18 + iVar12) + 0.5) /
                                       (double)(int)uVar38 + -0.5;
                              dVar80 = ((double)(int)(uVar25 - uVar13 * local_428) + 0.5) /
                                       (double)local_428 + -0.5;
                              *(double *)(local_530 + lVar40 * 8) =
                                   dVar76 * dVar80 * dVar81 +
                                   dVar80 * dVar80 * dVar74 +
                                   ((double)local_340.p
                                            [(int)(uVar43 - local_340.begin.y) * local_340.jstride +
                                             lVar37 + lVar62 + lVar23] -
                                   (double)local_340.p
                                           [(int)(uVar15 - local_340.begin.y) * local_340.jstride +
                                            lVar37 + lVar62 + lVar23]) * dVar82 * dVar80 +
                                   dVar76 * dVar76 * dVar75 +
                                   ((double)local_340.p
                                            [lVar24 + (long)(int)(uVar64 - local_340.begin.x) +
                                                      lVar62 + lVar23] -
                                   (double)local_340.p
                                           [lVar24 + (long)(int)(uVar39 - local_340.begin.x) +
                                                     lVar62 + lVar23]) * dVar83 * dVar76 +
                                   (double)local_340.p[lVar24 + lVar37 + lVar62 + lVar23];
                              lVar40 = lVar40 + 1;
                            } while (~uVar47 + uVar18 + (int)lVar40 != 0);
                          }
                          uVar22 = uVar22 + 1;
                          local_530 = local_530 + local_300.jstride * 8;
                          iVar14 = iVar14 + 1;
                          iVar11 = iVar11 + 1;
                        } while (iVar3 + 1 != (int)uVar22);
                      }
                      bVar72 = uVar41 != uVar2;
                      uVar41 = uVar41 + 1;
                    } while (bVar72);
                  }
                  local_358 = local_358 + 1;
                  local_4b8 = local_4b8 + 8;
                } while (local_358 != uVar16);
              }
            }
            else if (iVar33 == 1) {
              if (0 < num_comp) {
                uVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
                uVar2 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
                iVar3 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1];
                uVar18 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
                uVar47 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
                iVar33 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
                uVar22 = (ulong)iVar33;
                auVar7._4_8_ = extraout_XMM0_Qb;
                auVar7._0_4_ = iStack_424;
                auVar78._0_8_ = (double)(int)uVar38;
                auVar78._8_8_ = (double)iStack_424;
                lVar57 = (long)(int)uVar18;
                local_4b8 = 0;
                local_480 = lVar28;
                do {
                  if ((int)uVar1 <= (int)uVar2) {
                    iVar14 = uVar1 + iStack_424;
                    uVar41 = uVar1;
                    do {
                      if (iVar33 <= iVar3) {
                        uVar49 = uVar41 + 1;
                        uVar48 = -uVar49;
                        if (0 < (int)uVar49) {
                          uVar48 = uVar49;
                        }
                        lVar51 = (int)(uVar41 - local_2a8.begin.z) * local_2a8.kstride;
                        lVar23 = local_340.nstride * (lVar44 + local_4b8);
                        lVar46 = (long)(int)((uVar41 - iStack_424) - local_2a8.begin.z);
                        lVar59 = local_2a8.kstride * lVar46;
                        lVar30 = (int)((iStack_424 + uVar41) - local_2a8.begin.z) *
                                 local_2a8.kstride;
                        uVar55 = ~(uVar48 >> 1);
                        uVar49 = ~(uVar48 >> 2);
                        if (-1 < (int)uVar41) {
                          uVar55 = uVar41 >> 1;
                          uVar49 = uVar41 >> 2;
                        }
                        local_508 = (long)local_300.p +
                                    local_300.nstride * local_480 +
                                    (uVar22 - (long)local_300.begin.y) * local_300.jstride * 8 +
                                    ((long)(int)uVar41 - (long)local_300.begin.z) *
                                    local_300.kstride * 8 + (long)local_300.begin.x * -8 +
                                    lVar57 * 8;
                        lVar31 = local_2a8.jstride * 4;
                        lVar40 = (uVar22 - (long)local_2a8.begin.y) * lVar31;
                        local_500 = (long)local_2a8.p +
                                    (long)(iVar14 - local_2a8.begin.z) * local_2a8.kstride * 4 +
                                    lVar40 + (long)local_2a8.begin.x * -4 + lVar57 * 4;
                        local_530 = (long)local_2a8.p +
                                    local_2a8.kstride * 4 * lVar46 + lVar40 +
                                    (long)local_2a8.begin.x * -4 + lVar57 * 4;
                        uVar29 = uVar22;
                        do {
                          if ((int)uVar18 <= (int)uVar47) {
                            uVar25 = (uint)uVar29;
                            uVar9 = uVar25 + 1;
                            uVar19 = -uVar9;
                            if (0 < (int)uVar9) {
                              uVar19 = uVar9;
                            }
                            lVar46 = (uVar29 - (long)local_2a8.begin.y) * local_2a8.jstride;
                            uVar63 = ~(uVar19 >> 1);
                            uVar9 = ~(uVar19 >> 2);
                            if (-1 < (long)uVar29) {
                              uVar63 = (uint)(uVar29 >> 1) & 0x7fffffff;
                              uVar9 = (uint)(uVar29 >> 2) & 0x3fffffff;
                            }
                            lVar40 = 0;
                            do {
                              lVar52 = lVar57 + lVar40;
                              uVar50 = (ulong)uVar18 + lVar40;
                              uVar10 = (uint)uVar50;
                              iVar11 = (int)lVar40;
                              if (uVar38 == 4) {
                                if (lVar52 < 0) {
                                  uVar13 = uVar18 + iVar11 + 1;
                                  uVar10 = -uVar13;
                                  if (0 < (int)uVar13) {
                                    uVar10 = uVar13;
                                  }
                                  uVar10 = uVar10 >> 2;
LAB_00753b20:
                                  uVar50 = (ulong)~uVar10;
                                }
                                else {
                                  uVar50 = (ulong)(uVar10 >> 2);
                                }
                              }
                              else if (uVar38 == 2) {
                                if (lVar52 < 0) {
                                  uVar13 = uVar18 + iVar11 + 1;
                                  uVar10 = -uVar13;
                                  if (0 < (int)uVar13) {
                                    uVar10 = uVar13;
                                  }
                                  uVar10 = uVar10 >> 1;
                                  goto LAB_00753b20;
                                }
                                uVar50 = (ulong)(uVar10 >> 1);
                              }
                              else if (uVar38 != 1) {
                                if (lVar52 < 0) {
                                  iVar26 = uVar18 + iVar11 + 1;
                                  iVar12 = -iVar26;
                                  if (0 < iVar26) {
                                    iVar12 = iVar26;
                                  }
                                  uVar10 = iVar12 / (int)uVar38;
                                  goto LAB_00753b20;
                                }
                                uVar50 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                               uVar50 & 0xffffffff) / (long)(int)uVar38 & 0xffffffff
                                ;
                              }
                              uVar10 = uVar25;
                              if (((local_428 != 1) && (uVar10 = uVar9, local_428 != 4)) &&
                                 (uVar10 = uVar63, local_428 != 2)) {
                                if ((long)uVar29 < 0) {
                                  uVar10 = ~((int)uVar19 / local_428);
                                }
                                else {
                                  uVar10 = (uint)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20
                                                        | uVar29 & 0xffffffff) / (long)local_428);
                                }
                              }
                              uVar58 = (ulong)uVar41;
                              if (((iStack_424 != 1) && (uVar58 = (ulong)uVar49, iStack_424 != 4))
                                 && (uVar58 = (ulong)uVar55, iStack_424 != 2)) {
                                if ((int)uVar41 < 0) {
                                  uVar58 = (ulong)(uint)~((int)uVar48 / iStack_424);
                                }
                                else {
                                  uVar58 = (long)(int)uVar41 / (long)iStack_424 & 0xffffffff;
                                }
                              }
                              iVar21 = (int)uVar58;
                              lVar52 = (long)(int)(((uVar18 - uVar38) - local_2a8.begin.x) + iVar11)
                              ;
                              iVar12 = (int)uVar50;
                              iVar20 = iVar12 + -1;
                              iVar26 = iVar12;
                              if (local_2a8.p[lVar46 + lVar52 + lVar51] == 1) {
                                iVar26 = iVar20;
                              }
                              lVar61 = (long)(int)(((uVar18 + uVar38) - local_2a8.begin.x) + iVar11)
                              ;
                              iVar70 = iVar12 + 1;
                              iVar42 = iVar12;
                              if (local_2a8.p[lVar46 + lVar61 + lVar51] == 1) {
                                iVar42 = iVar70;
                              }
                              lVar24 = ((long)(int)uVar10 - (long)local_340.begin.y) *
                                       local_340.jstride;
                              lVar62 = (iVar21 - local_340.begin.z) * local_340.kstride;
                              dVar74 = 0.0;
                              dVar75 = 0.0;
                              if (iVar42 == iVar26 + 2) {
                                dVar75 = (((double)local_340.p
                                                   [lVar24 + (long)(iVar70 - local_340.begin.x) +
                                                             lVar62 + lVar23] -
                                          (local_340.p
                                           [lVar24 + (long)(iVar12 - local_340.begin.x) +
                                                     lVar62 + lVar23] +
                                          (double)local_340.p
                                                  [lVar24 + (long)(iVar12 - local_340.begin.x) +
                                                            lVar62 + lVar23])) +
                                         (double)local_340.p
                                                 [lVar24 + (long)(iVar20 - local_340.begin.x) +
                                                           lVar62 + lVar23]) * 0.5;
                              }
                              iVar71 = iVar21 + -1;
                              iVar34 = iVar21;
                              if (*(int *)(local_530 + lVar40 * 4) == 1) {
                                iVar34 = iVar71;
                              }
                              iVar68 = iVar21 + 1;
                              if (*(int *)(local_500 + lVar40 * 4) == 1) {
                                iVar21 = iVar68;
                              }
                              lVar37 = (long)(iVar12 - local_340.begin.x);
                              if (iVar21 == iVar34 + 2) {
                                dVar74 = (((double)local_340.p
                                                   [lVar24 + lVar37 + (iVar68 - local_340.begin.z) *
                                                                      local_340.kstride + lVar23] -
                                          (local_340.p[lVar24 + lVar37 + lVar62 + lVar23] +
                                          (double)local_340.p[lVar24 + lVar37 + lVar62 + lVar23])) +
                                         (double)local_340.p
                                                 [lVar24 + lVar37 + (iVar71 - local_340.begin.z) *
                                                                    local_340.kstride + lVar23]) *
                                         0.5;
                              }
                              dVar81 = 0.0;
                              if (((local_2a8.p[lVar46 + lVar52 + lVar59] == 1) &&
                                  (local_2a8.p[lVar46 + lVar61 + lVar59] == 1)) &&
                                 ((local_2a8.p[lVar46 + lVar52 + lVar30] == 1 &&
                                  (local_2a8.p[lVar46 + lVar61 + lVar30] == 1)))) {
                                lVar61 = (iVar68 - local_340.begin.z) * local_340.kstride;
                                lVar52 = (iVar71 - local_340.begin.z) * local_340.kstride;
                                dVar81 = ((((double)local_340.p
                                                    [lVar24 + (long)(iVar70 - local_340.begin.x) +
                                                              lVar61 + lVar23] -
                                           (double)local_340.p
                                                   [lVar24 + (long)(iVar20 - local_340.begin.x) +
                                                             lVar61 + lVar23]) +
                                          (double)local_340.p
                                                  [lVar24 + (long)(iVar20 - local_340.begin.x) +
                                                            lVar52 + lVar23]) -
                                         (double)local_340.p
                                                 [lVar24 + (long)(iVar70 - local_340.begin.x) +
                                                           lVar52 + lVar23]) * 0.25;
                              }
                              dVar82 = 1.0;
                              if (iVar21 != iVar34 + 1) {
                                dVar82 = 0.5;
                              }
                              dVar83 = 1.0;
                              if (iVar42 != iVar26 + 1) {
                                dVar83 = 0.5;
                              }
                              auVar79._0_8_ =
                                   (double)(int)((uVar18 + iVar11) -
                                                (int)((uVar50 & 0xffffffff) * (ulong)uVar38)) + 0.5;
                              auVar79._8_8_ =
                                   (double)(int)(uVar41 - (int)((auVar7._0_8_ & 0xffffffff) * uVar58
                                                               )) + 0.5;
                              auVar79 = divpd(auVar79,auVar78);
                              dVar76 = auVar79._0_8_ + -0.5;
                              dVar80 = auVar79._8_8_ + -0.5;
                              *(double *)(local_508 + lVar40 * 8) =
                                   dVar76 * dVar80 * dVar81 +
                                   dVar80 * dVar80 * dVar74 +
                                   ((double)local_340.p
                                            [lVar24 + lVar37 + (iVar21 - local_340.begin.z) *
                                                               local_340.kstride + lVar23] -
                                   (double)local_340.p
                                           [lVar24 + lVar37 + (iVar34 - local_340.begin.z) *
                                                              local_340.kstride + lVar23]) * dVar82
                                   * dVar80 +
                                   dVar76 * dVar76 * dVar75 +
                                   ((double)local_340.p
                                            [lVar24 + (long)(iVar42 - local_340.begin.x) +
                                                      lVar62 + lVar23] -
                                   (double)local_340.p
                                           [lVar24 + (long)(iVar26 - local_340.begin.x) +
                                                     lVar62 + lVar23]) * dVar83 * dVar76 +
                                   (double)local_340.p[lVar24 + lVar37 + lVar62 + lVar23];
                              lVar40 = lVar40 + 1;
                            } while (~uVar47 + uVar18 + (int)lVar40 != 0);
                          }
                          uVar29 = uVar29 + 1;
                          local_508 = local_508 + local_300.jstride * 8;
                          local_500 = local_500 + lVar31;
                          local_530 = local_530 + lVar31;
                        } while (iVar3 + 1 != (int)uVar29);
                      }
                      iVar14 = iVar14 + 1;
                      bVar72 = uVar41 != uVar2;
                      uVar41 = uVar41 + 1;
                    } while (bVar72);
                  }
                  local_4b8 = local_4b8 + 1;
                  local_480 = local_480 + 8;
                } while (local_4b8 != uVar16);
              }
            }
            else if ((iVar33 == 0) && (0 < num_comp)) {
              uVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
              uVar2 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
              iVar3 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1];
              uVar18 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
              uVar47 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
              iVar33 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
              uVar29 = (ulong)iVar33;
              auVar73._0_8_ = (double)local_428;
              auVar73._8_8_ = (double)iStack_424;
              lVar57 = (long)(int)uVar18;
              local_490 = 0;
              local_488 = lVar28;
              do {
                if ((int)uVar1 <= (int)uVar2) {
                  iVar14 = uVar1 + iStack_424;
                  uVar41 = uVar1;
                  do {
                    if (iVar33 <= iVar3) {
                      lVar23 = (long)local_2a8.begin.x;
                      uVar49 = uVar41 + 1;
                      uVar48 = -uVar49;
                      if (0 < (int)uVar49) {
                        uVar48 = uVar49;
                      }
                      lVar51 = local_340.nstride * (lVar44 + local_490);
                      uVar49 = ~(uVar48 >> 2);
                      if (-1 < (int)uVar41) {
                        uVar49 = uVar41 >> 2;
                      }
                      uVar55 = ~(uVar48 >> 1);
                      if (-1 < (int)uVar41) {
                        uVar55 = uVar41 >> 1;
                      }
                      local_508 = (long)local_300.p +
                                  local_300.nstride * local_488 +
                                  (uVar29 - (long)local_300.begin.y) * local_300.jstride * 8 +
                                  ((long)(int)uVar41 - (long)local_300.begin.z) * local_300.kstride
                                  * 8 + (long)local_300.begin.x * -8 + lVar57 * 8;
                      lVar30 = local_2a8.kstride * 4;
                      iVar11 = iVar33 - (local_2a8.begin.y + local_428);
                      lVar61 = (iVar14 - local_2a8.begin.z) * lVar30;
                      lVar52 = (int)(uVar41 - (iStack_424 + local_2a8.begin.z)) * lVar30;
                      iVar12 = (local_428 + iVar33) - local_2a8.begin.y;
                      lVar40 = local_2a8.jstride * 4;
                      lVar31 = (uVar29 - (long)local_2a8.begin.y) * lVar40;
                      lVar46 = lVar61 + lVar23 * -4 + lVar57 * 4;
                      lVar59 = lVar52 + lVar23 * -4 + lVar57 * 4;
                      lVar30 = ((long)(int)uVar41 - (long)local_2a8.begin.z) * lVar30 + lVar23 * -4
                               + lVar57 * 4;
                      local_4e8 = (long)local_2a8.p + lVar61 + lVar31 + lVar23 * -4 + lVar57 * 4;
                      local_4c8 = (long)local_2a8.p + lVar31 + lVar52 + lVar23 * -4 + lVar57 * 4;
                      uVar50 = uVar29;
                      do {
                        if ((int)uVar18 <= (int)uVar47) {
                          lVar23 = iVar11 * lVar40;
                          lVar31 = iVar12 * lVar40;
                          iVar26 = (int)uVar50;
                          uVar19 = iVar26 + 1;
                          uVar25 = -uVar19;
                          if (0 < (int)uVar19) {
                            uVar25 = uVar19;
                          }
                          uVar19 = ~(uVar25 >> 2);
                          if (-1 < (long)uVar50) {
                            uVar19 = (uint)(uVar50 >> 2) & 0x3fffffff;
                          }
                          uVar9 = ~(uVar25 >> 1);
                          if (-1 < (long)uVar50) {
                            uVar9 = (uint)(uVar50 >> 1) & 0x7fffffff;
                          }
                          lVar52 = 0;
                          do {
                            lVar61 = lVar57 + lVar52;
                            uVar63 = (uint)((ulong)uVar18 + lVar52);
                            iVar21 = (int)lVar52;
                            if (uVar38 == 4) {
                              if (lVar61 < 0) {
                                uVar10 = uVar18 + iVar21 + 1;
                                uVar63 = -uVar10;
                                if (0 < (int)uVar10) {
                                  uVar63 = uVar10;
                                }
                                uVar63 = uVar63 >> 2;
LAB_00752e4b:
                                uVar63 = ~uVar63;
                              }
                              else {
                                uVar63 = uVar63 >> 2;
                              }
                            }
                            else if (uVar38 == 2) {
                              if (lVar61 < 0) {
                                uVar10 = uVar18 + iVar21 + 1;
                                uVar63 = -uVar10;
                                if (0 < (int)uVar10) {
                                  uVar63 = uVar10;
                                }
                                uVar63 = ~(uVar63 >> 1);
                              }
                              else {
                                uVar63 = uVar63 >> 1;
                              }
                            }
                            else if (uVar38 != 1) {
                              if (lVar61 < 0) {
                                iVar20 = uVar18 + iVar21 + 1;
                                iVar21 = -iVar20;
                                if (0 < iVar20) {
                                  iVar21 = iVar20;
                                }
                                uVar63 = iVar21 / (int)uVar38;
                                goto LAB_00752e4b;
                              }
                              uVar63 = (uint)((long)((ulong)(uint)((int)uVar63 >> 0x1f) << 0x20 |
                                                    (ulong)uVar18 + lVar52 & 0xffffffff) /
                                             (long)(int)uVar38);
                            }
                            uVar58 = uVar50 & 0xffffffff;
                            if (((local_428 != 1) && (uVar58 = (ulong)uVar19, local_428 != 4)) &&
                               (uVar58 = (ulong)uVar9, local_428 != 2)) {
                              if ((long)uVar50 < 0) {
                                uVar58 = (ulong)(uint)~((int)uVar25 / local_428);
                              }
                              else {
                                uVar58 = (long)((ulong)(uint)(iVar26 >> 0x1f) << 0x20 |
                                               uVar50 & 0xffffffff) / (long)local_428 & 0xffffffff;
                              }
                            }
                            iVar21 = (int)uVar58;
                            uVar45 = (ulong)uVar41;
                            if (((iStack_424 != 1) && (uVar45 = (ulong)uVar49, iStack_424 != 4)) &&
                               (uVar45 = (ulong)uVar55, iStack_424 != 2)) {
                              if ((int)uVar41 < 0) {
                                uVar45 = (ulong)(uint)~((int)uVar48 / iStack_424);
                              }
                              else {
                                uVar45 = (long)(int)uVar41 / (long)iStack_424 & 0xffffffff;
                              }
                            }
                            iVar42 = (int)uVar45;
                            iVar70 = iVar21 + -1;
                            iVar20 = iVar21;
                            if (*(int *)((long)local_2a8.p + lVar52 * 4 + lVar23 + lVar30) == 1) {
                              iVar20 = iVar70;
                            }
                            iVar71 = iVar21 + 1;
                            iVar34 = iVar21;
                            if (*(int *)((long)local_2a8.p + lVar52 * 4 + lVar31 + lVar30) == 1) {
                              iVar34 = iVar71;
                            }
                            lVar62 = (long)(int)uVar63 - (long)local_340.begin.x;
                            lVar61 = (iVar42 - local_340.begin.z) * local_340.kstride;
                            dVar74 = 0.0;
                            dVar75 = 0.0;
                            if (iVar34 == iVar20 + 2) {
                              dVar75 = (((double)local_340.p
                                                 [(iVar71 - local_340.begin.y) * local_340.jstride +
                                                  lVar62 + lVar61 + lVar51] -
                                        (local_340.p
                                         [(iVar21 - local_340.begin.y) * local_340.jstride +
                                          lVar62 + lVar61 + lVar51] +
                                        (double)local_340.p
                                                [(iVar21 - local_340.begin.y) * local_340.jstride +
                                                 lVar62 + lVar61 + lVar51])) +
                                       (double)local_340.p
                                               [(iVar70 - local_340.begin.y) * local_340.jstride +
                                                lVar62 + lVar61 + lVar51]) * 0.5;
                            }
                            iVar35 = iVar42 + -1;
                            iVar68 = iVar42;
                            if (*(int *)(local_4c8 + lVar52 * 4) == 1) {
                              iVar68 = iVar35;
                            }
                            iVar67 = iVar42 + 1;
                            if (*(int *)(local_4e8 + lVar52 * 4) == 1) {
                              iVar42 = iVar67;
                            }
                            lVar24 = (iVar21 - local_340.begin.y) * local_340.jstride;
                            if (iVar42 == iVar68 + 2) {
                              dVar74 = (((double)local_340.p
                                                 [lVar24 + lVar62 + (iVar67 - local_340.begin.z) *
                                                                    local_340.kstride + lVar51] -
                                        (local_340.p[lVar24 + lVar62 + lVar61 + lVar51] +
                                        (double)local_340.p[lVar24 + lVar62 + lVar61 + lVar51])) +
                                       (double)local_340.p
                                               [lVar24 + lVar62 + (iVar35 - local_340.begin.z) *
                                                                  local_340.kstride + lVar51]) * 0.5
                              ;
                            }
                            dVar81 = 0.0;
                            if (((*(int *)((long)local_2a8.p + lVar52 * 4 + lVar23 + lVar59) == 1)
                                && (*(int *)((long)local_2a8.p + lVar52 * 4 + lVar31 + lVar59) == 1)
                                ) && ((*(int *)((long)local_2a8.p + lVar52 * 4 + lVar23 + lVar46) ==
                                       1 && (*(int *)((long)local_2a8.p +
                                                     lVar52 * 4 + lVar31 + lVar46) == 1)))) {
                              lVar53 = (iVar71 - local_340.begin.y) * local_340.jstride;
                              lVar65 = (iVar67 - local_340.begin.z) * local_340.kstride;
                              lVar37 = (iVar70 - local_340.begin.y) * local_340.jstride;
                              lVar66 = (iVar35 - local_340.begin.z) * local_340.kstride;
                              dVar81 = ((((double)local_340.p[lVar53 + lVar62 + lVar65 + lVar51] -
                                         (double)local_340.p[lVar37 + lVar62 + lVar65 + lVar51]) +
                                        (double)local_340.p[lVar37 + lVar62 + lVar66 + lVar51]) -
                                       (double)local_340.p[lVar53 + lVar62 + lVar66 + lVar51]) *
                                       0.25;
                            }
                            dVar82 = 1.0;
                            if (iVar42 != iVar68 + 1) {
                              dVar82 = 0.5;
                            }
                            dVar83 = 1.0;
                            if (iVar34 != iVar20 + 1) {
                              dVar83 = 0.5;
                            }
                            auVar77._0_8_ =
                                 (double)(iVar26 - (int)(uVar58 * (uVar22 & 0xffffffff))) + 0.5;
                            auVar77._8_8_ =
                                 (double)(int)(uVar41 - (int)((uVar22 >> 0x20) * uVar45)) + 0.5;
                            auVar78 = divpd(auVar77,auVar73);
                            dVar76 = auVar78._0_8_ + -0.5;
                            dVar80 = auVar78._8_8_ + -0.5;
                            *(double *)(local_508 + lVar52 * 8) =
                                 dVar76 * dVar80 * dVar81 +
                                 dVar80 * dVar80 * dVar74 +
                                 ((double)local_340.p
                                          [lVar24 + lVar62 + (iVar42 - local_340.begin.z) *
                                                             local_340.kstride + lVar51] -
                                 (double)local_340.p
                                         [lVar24 + lVar62 + (iVar68 - local_340.begin.z) *
                                                            local_340.kstride + lVar51]) * dVar82 *
                                 dVar80 + dVar76 * dVar76 * dVar75 +
                                          ((double)local_340.p
                                                   [(iVar34 - local_340.begin.y) * local_340.jstride
                                                    + lVar62 + lVar61 + lVar51] -
                                          (double)local_340.p
                                                  [(iVar20 - local_340.begin.y) * local_340.jstride
                                                   + lVar62 + lVar61 + lVar51]) * dVar83 * dVar76 +
                                          (double)local_340.p[lVar24 + lVar62 + lVar61 + lVar51];
                            lVar52 = lVar52 + 1;
                          } while (~uVar47 + uVar18 + (int)lVar52 != 0);
                        }
                        uVar50 = uVar50 + 1;
                        local_508 = local_508 + local_300.jstride * 8;
                        iVar11 = iVar11 + 1;
                        iVar12 = iVar12 + 1;
                        local_4e8 = local_4e8 + lVar40;
                        local_4c8 = local_4c8 + lVar40;
                      } while (iVar3 + 1 != (int)uVar50);
                    }
                    iVar14 = iVar14 + 1;
                    bVar72 = uVar41 != uVar2;
                    uVar41 = uVar41 + 1;
                  } while (bVar72);
                }
                local_490 = local_490 + 1;
                local_488 = local_488 + 8;
              } while (local_490 != uVar16);
            }
          }
        }
        ratio = local_250;
        uVar54 = uVar54 + 1;
      } while (uVar54 != 6);
      MFIter::operator++((MFIter *)local_248);
    } while ((int)local_238.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_220);
  }
  MFIter::~MFIter((MFIter *)local_248);
  MultiFab::~MultiFab(&local_1b0);
  return;
}

Assistant:

void
InterpBndryData::BndryValuesDoIt (BndryRegister&  crse,
                                  int             c_start,
                                  const MultiFab* fine,
                                  int             f_start,
                                  int             bnd_start,
                                  int             num_comp,
                                  const IntVect&  ratio,
                                  const BCRec*    bc,
                                  int             max_order)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(fine == nullptr || grids == fine->boxArray());
    //
    // Set bndry types and bclocs.
    //
    if (bc != nullptr) {
        for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
            setBndryConds(*bc, ratio, n);
        }
    }
    //
    // First interpolate from coarse to fine on bndry.
    //
    const Box& fine_domain = geom.Domain();

    //
    // Mask turned off if covered by fine grid.
    //
    if (max_order==3 || max_order==1)
    {
        MultiFab foo(grids,bndry[0].DistributionMap(), 1, 0, MFInfo().SetAlloc(false), FArrayBoxFactory());

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(foo,info); mfi.isValid(); ++mfi)
        {
            BL_ASSERT(grids[mfi.index()] == mfi.validbox());

            const Box& fine_bx  = mfi.validbox();

            for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
            {
                const int               dir  = ((i<AMREX_SPACEDIM) ? i : (i-AMREX_SPACEDIM));
                const Orientation::Side side = ((i<AMREX_SPACEDIM) ? Orientation::low : Orientation::high);

                const Orientation face(dir,side);

                if (fine_bx[face] != fine_domain[face] || geom.isPeriodic(dir))
                {
                    auto const crse_array = crse[face].array(mfi);
                    auto       bdry_array = bndry[face].array(mfi);
                    Box const& b = bndry[face][mfi].box();
                    const auto rr = ratio.dim3();
                    //
                    // Internal or periodic edge, interpolate from crse data.
                    //
                    if (max_order == 1)
                    {
                        AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                        {
                            interpbndrydata_o1(it,jt,kt,n,bdry_array,bnd_start,
                                               crse_array,c_start,rr);
                        });
                    }
                    else
                    {
                        auto const mask_array = masks[face].array(mfi);
                        int is_not_covered = BndryData::not_covered;
                        switch (dir) {
                        case 0:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_x_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM >= 2)
                        case 1:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_y_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM == 3)
                        case 2:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_z_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#endif
#endif
                        default: {}
                        }
                    }
                }
                else if (fine != nullptr)
                {
                    //
                    // Physical bndry, copy from ghost region of corresponding grid
                    //
                    auto& bnd_fab = bndry[face][mfi];
                    auto const& src_fab = (*fine)[mfi];
                    auto bnd_array = bnd_fab.array();
                    auto const src_array = src_fab.array();
                    const Box& b = bnd_fab.box() & src_fab.box();
                    AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, ii, jj, kk, nn,
                    {
                        bnd_array(ii,jj,kk,nn+bnd_start) = src_array(ii,jj,kk,nn+f_start);
                    });
                }
            }
        }
    }
    else
    {
        amrex::Abort("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    }
}